

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::String::FormatIntWidth2_abi_cxx11_(int value)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ostream *poVar3;
  int in_ESI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  undefined1 local_188 [380];
  int local_c;
  
  local_c = in_ESI;
  std::__cxx11::stringstream::stringstream(local_198);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(local_188,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,local_c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string String::FormatIntWidth2(int value) {
  std::stringstream ss;
  ss << std::setfill('0') << std::setw(2) << value;
  return ss.str();
}